

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  char cVar1;
  undefined8 uVar2;
  long lVar3;
  ImVec2 cr_max;
  ImVec2 cr_min;
  ImGuiContext *pIVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int i;
  ImGuiID IVar8;
  char *pcVar9;
  ImGuiTableColumn *pIVar10;
  byte *pbVar11;
  ImU32 *in_RDI;
  bool bVar12;
  float fVar13;
  float id;
  float fVar14;
  float rhs;
  ImGuiWindow *inner_window;
  ImGuiID context_menu_id;
  float unused_x1;
  bool is_visible;
  float max_width;
  ImGuiTableColumn *column_4;
  int column_n_3;
  int order_n_2;
  ImRect host_clip_rect;
  float offset_x;
  bool offset_x_frozen;
  int visible_n;
  bool is_hovering_table;
  ImRect mouse_hit_rect;
  ImGuiTableColumn *column_3;
  int order_n_1;
  float weight_ratio;
  ImGuiTableColumn *column_2;
  int column_n_2;
  float width_remaining_for_stretched_columns;
  float width_avail_for_stretched_columns;
  float width_avail;
  float width_spacings;
  ImRect work_rect;
  float width_auto;
  bool column_is_resizable_1;
  ImGuiTableColumn *column_1;
  int column_n_1;
  float stretch_sum_weights;
  float sum_width_requests;
  bool column_is_resizable;
  bool start_auto_fit;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float fixed_max_width_auto;
  float stretch_sum_width_auto;
  bool has_resizable;
  bool has_auto_fit_request;
  int last_visible_column_idx;
  int count_stretch;
  int count_fixed;
  ImGuiTableFlags table_sizing_policy;
  ImGuiContext *g;
  float in_stack_fffffffffffffec0;
  byte bVar15;
  float in_stack_fffffffffffffec4;
  float in_stack_fffffffffffffec8;
  undefined3 uVar16;
  float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  ImU32 idx;
  ImU32 IVar17;
  ImU32 IVar18;
  ImDrawList *in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  undefined2 in_stack_fffffffffffffef4;
  ImGuiTableColumnIdx in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_ffffffffffffff10;
  int local_d4;
  ulong local_d0;
  float local_c8;
  float local_c0;
  int local_b8;
  ImU32 local_98;
  int local_84;
  float local_80;
  ImRect local_70;
  float local_60;
  undefined1 local_59;
  ImGuiTableColumn *local_58;
  int local_50;
  float local_4c;
  float local_48;
  undefined1 local_42;
  undefined1 local_41;
  ImGuiTableColumn *local_40;
  int local_34;
  int local_30;
  float local_2c;
  float local_28;
  byte local_22;
  byte local_21;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  ImGuiContext *local_10;
  ImU32 *local_8;
  
  pIVar4 = GImGui;
  local_10 = GImGui;
  local_14 = in_RDI[1] & 0xe000;
  *(undefined1 *)(in_RDI + 0x94) = 1;
  *(undefined1 *)((long)in_RDI + 0x231) = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  local_8 = in_RDI;
  fVar13 = ImMax<float>(1.0,(pIVar4->Style).FramePadding.x * 1.0);
  local_8[0x2d] = (ImU32)fVar13;
  local_18 = 0;
  local_1c = 0;
  local_20 = -1;
  local_21 = 0;
  local_22 = 0;
  local_28 = 0.0;
  local_2c = 0.0;
  for (local_30 = 0; local_30 < (int)local_8[0x1b]; local_30 = local_30 + 1) {
    pcVar9 = ImSpan<signed_char>::operator[]((ImSpan<signed_char> *)(local_8 + 8),local_30);
    local_34 = (int)*pcVar9;
    if (local_34 != local_30) {
      *(undefined1 *)(local_8 + 0x94) = 0;
    }
    local_40 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(local_8 + 4),local_34);
    if (*(char *)((long)local_8 + 0x233) <= local_34) {
      TableSetupColumnFlags
                ((ImGuiTable *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (ImGuiTableColumn *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (ImGuiTableColumnFlags)in_stack_fffffffffffffec4);
      local_40->NameOffset = -1;
      local_40->UserID = 0;
      local_40->InitStretchWeightOrWidth = -1.0;
    }
    if (((local_8[1] & 4) == 0) || ((local_40->Flags & 0x40U) != 0)) {
      local_40->IsEnabledNextFrame = true;
    }
    if ((local_40->IsEnabled & 1U) != (local_40->IsEnabledNextFrame & 1U)) {
      local_40->IsEnabled = (bool)(local_40->IsEnabledNextFrame & 1);
      *(undefined1 *)((long)local_8 + 0x24f) = 1;
      if (((local_40->IsEnabled & 1U) == 0) && (local_40->SortOrder != -1)) {
        *(undefined1 *)((long)local_8 + 0x24b) = 1;
      }
    }
    if (('\0' < local_40->SortOrder) && ((local_8[1] & 0x4000000) == 0)) {
      *(undefined1 *)((long)local_8 + 0x24b) = 1;
    }
    if ((local_40->Flags & 8U) == 0) {
      in_stack_fffffffffffffef7 = local_40->StretchWeight <= 0.0 && local_40->StretchWeight != 0.0;
    }
    else {
      in_stack_fffffffffffffef7 = local_40->WidthRequest <= 0.0 && local_40->WidthRequest != 0.0;
    }
    if ((bool)in_stack_fffffffffffffef7 != false) {
      local_40->CannotSkipItemsQueue = '\a';
      local_40->AutoFitQueue = '\a';
    }
    local_41 = in_stack_fffffffffffffef7;
    if ((local_40->IsEnabled & 1U) == 0) {
      local_40->IndexWithinEnabledSet = -1;
    }
    else {
      local_40->PrevEnabledColumn = (ImGuiTableColumnIdx)local_20;
      local_40->NextEnabledColumn = -1;
      if (local_20 != -1) {
        in_stack_fffffffffffffef6 = (ImGuiTableColumnIdx)local_34;
        pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                            ((ImSpan<ImGuiTableColumn> *)(local_8 + 4),local_20);
        pIVar10->NextEnabledColumn = in_stack_fffffffffffffef6;
      }
      cVar1 = *(char *)((long)local_8 + 0x231);
      *(char *)((long)local_8 + 0x231) = cVar1 + '\x01';
      local_40->IndexWithinEnabledSet = cVar1;
      *(ulong *)(local_8 + 0x12) = 1L << ((byte)local_34 & 0x3f) | *(ulong *)(local_8 + 0x12);
      *(ulong *)(local_8 + 0x10) =
           1L << (local_40->DisplayOrder & 0x3fU) | *(ulong *)(local_8 + 0x10);
      local_20 = local_34;
      if ((local_40->IsPreserveWidthAuto & 1U) == 0) {
        fVar13 = TableGetColumnWidthAuto
                           ((ImGuiTable *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            (ImGuiTableColumn *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        local_40->WidthAuto = fVar13;
      }
      local_42 = (local_40->Flags & 0x10U) == 0;
      if ((bool)local_42) {
        local_22 = 1;
      }
      if ((((local_40->Flags & 8U) != 0) && (0.0 < local_40->InitStretchWeightOrWidth)) &&
         (!(bool)local_42)) {
        local_40->WidthAuto = local_40->InitStretchWeightOrWidth;
      }
      if (local_40->AutoFitQueue != '\0') {
        local_21 = 1;
      }
      if ((local_40->Flags & 4U) == 0) {
        local_2c = ImMax<float>(local_2c,local_40->WidthAuto);
        local_18 = local_18 + 1;
      }
      else {
        local_28 = local_40->WidthAuto + local_28;
        local_1c = local_1c + 1;
      }
    }
  }
  if ((((local_8[1] & 8) != 0) && ((char)local_8[0x8c] == '\0')) && ((local_8[1] & 0x8000000) == 0))
  {
    *(undefined1 *)((long)local_8 + 0x24b) = 1;
  }
  *(char *)((long)local_8 + 0x23e) = (char)local_20;
  if (((local_21 & 1) != 0) && (*(long *)(local_8 + 0x72) != *(long *)(local_8 + 0x74))) {
    *(undefined1 *)(*(long *)(local_8 + 0x74) + 0x93) = 0;
  }
  if ((local_21 & 1) != 0) {
    *(undefined1 *)((long)local_8 + 0x24f) = 1;
  }
  local_48 = 0.0;
  local_4c = 0.0;
  *(undefined1 *)((long)local_8 + 0x23d) = 0xff;
  *(undefined1 *)(local_8 + 0x8f) = 0xff;
  for (local_50 = 0; local_50 < (int)local_8[0x1b]; local_50 = local_50 + 1) {
    if ((*(ulong *)(local_8 + 0x12) & 1L << ((byte)local_50 & 0x3f)) != 0) {
      local_58 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)(local_8 + 4),local_50);
      local_59 = (local_58->Flags & 0x10U) == 0;
      if ((local_58->Flags & 8U) == 0) {
        if (((local_58->AutoFitQueue != '\0') ||
            (local_58->StretchWeight <= 0.0 && local_58->StretchWeight != 0.0)) || (!(bool)local_59)
           ) {
          if (local_58->InitStretchWeightOrWidth <= 0.0) {
            if (local_14 == 0x6000) {
              local_58->StretchWeight = (local_58->WidthAuto / local_28) * (float)local_1c;
            }
            else {
              local_58->StretchWeight = 1.0;
            }
          }
          else {
            local_58->StretchWeight = local_58->InitStretchWeightOrWidth;
          }
        }
        local_4c = local_58->StretchWeight + local_4c;
        if (((char)local_8[0x8f] == -1) ||
           (pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                                ((ImSpan<ImGuiTableColumn> *)(local_8 + 4),(int)(char)local_8[0x8f])
           , local_58->DisplayOrder < pIVar10->DisplayOrder)) {
          *(char *)(local_8 + 0x8f) = (char)local_50;
        }
        if ((*(char *)((long)local_8 + 0x23d) == -1) ||
           (pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                                ((ImSpan<ImGuiTableColumn> *)(local_8 + 4),
                                 (int)*(char *)((long)local_8 + 0x23d)),
           pIVar10->DisplayOrder < local_58->DisplayOrder)) {
          *(char *)((long)local_8 + 0x23d) = (char)local_50;
        }
      }
      else {
        local_60 = local_58->WidthAuto;
        if ((local_14 == 0x4000) && ((local_58->AutoFitQueue != '\0' || (!(bool)local_59)))) {
          local_60 = local_2c;
        }
        if (local_58->AutoFitQueue == '\0') {
          if ((((local_58->Flags & 8U) != 0) && (!(bool)local_59)) &&
             ((*(ulong *)(local_8 + 0x16) & 1L << ((byte)local_50 & 0x3f)) != 0)) {
            local_58->WidthRequest = local_60;
          }
        }
        else {
          local_58->WidthRequest = local_60;
        }
        if (((1 < local_58->AutoFitQueue) && ((*(byte *)((long)local_8 + 0x24a) & 1) != 0)) &&
           ((local_58->IsPreserveWidthAuto & 1U) == 0)) {
          fVar13 = ImMax<float>(local_58->WidthRequest,(float)local_8[0x2d] * 4.0);
          local_58->WidthRequest = fVar13;
        }
        local_48 = local_58->WidthRequest + local_48;
      }
      local_58->IsPreserveWidthAuto = false;
      local_48 = (float)local_8[0x2f] + (float)local_8[0x2f] + local_48;
    }
  }
  *(char *)((long)local_8 + 0x232) = (char)local_18;
  local_70.Min = *(ImVec2 *)(local_8 + 0x43);
  local_70.Max = *(ImVec2 *)(local_8 + 0x45);
  fVar13 = (float)local_8[0x2e] + (float)local_8[0x2e] +
           ((float)local_8[0x31] + (float)local_8[0x32]) *
           (float)(*(char *)((long)local_8 + 0x231) + -1);
  if ((((local_8[1] & 0x1000000) == 0) || ((float)local_8[0x35] != 0.0)) ||
     (NAN((float)local_8[0x35]))) {
    id = ImRect::GetWidth(&local_70);
  }
  else {
    id = ImRect::GetWidth((ImRect *)(local_8 + 0x47));
  }
  fVar14 = (id - fVar13) - local_48;
  local_8[0x36] =
       (ImU32)((float)local_8[0x2f] * 2.0 * (float)(int)*(char *)((long)local_8 + 0x231) + fVar13);
  local_80 = fVar14;
  for (local_84 = 0; local_84 < (int)local_8[0x1b]; local_84 = local_84 + 1) {
    if ((*(ulong *)(local_8 + 0x12) & 1L << ((byte)local_84 & 0x3f)) != 0) {
      pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                          ((ImSpan<ImGuiTableColumn> *)(local_8 + 4),local_84);
      if ((pIVar10->Flags & 4U) != 0) {
        fVar13 = ImMax<float>(fVar14 * (pIVar10->StretchWeight / local_4c),(float)local_8[0x2d]);
        pIVar10->WidthRequest = (float)(int)(fVar13 + 0.01);
        local_80 = local_80 - pIVar10->WidthRequest;
      }
      if ((pIVar10->NextEnabledColumn == -1) && ((char)local_8[0x8f] != -1)) {
        pIVar10->Flags = pIVar10->Flags | 0x40000000;
      }
      fVar13 = ImMax<float>(pIVar10->WidthRequest,(float)local_8[0x2d]);
      fVar13 = ImFloor(fVar13);
      pIVar10->WidthGiven = fVar13;
      local_8[0x36] = (ImU32)(pIVar10->WidthGiven + (float)local_8[0x36]);
    }
  }
  if ((1.0 <= local_80) && ((local_8[1] & 0x80000) == 0)) {
    local_98 = local_8[0x1b];
    while( true ) {
      local_98 = local_98 - 1;
      fVar13 = (float)((uint)in_stack_fffffffffffffeec & 0xffffff);
      if ((0.0 < local_4c) &&
         (fVar13 = (float)((uint)in_stack_fffffffffffffeec & 0xffffff), 1.0 <= local_80)) {
        fVar13 = (float)CONCAT13(-1 < (int)local_98,SUB43(in_stack_fffffffffffffeec,0));
      }
      in_stack_fffffffffffffeec = fVar13;
      if ((char)((uint)in_stack_fffffffffffffeec >> 0x18) == '\0') break;
      if ((*(ulong *)(local_8 + 0x10) & 1L << ((byte)local_98 & 0x3f)) != 0) {
        in_stack_fffffffffffffee0 = (ImDrawList *)(local_8 + 4);
        pcVar9 = ImSpan<signed_char>::operator[]((ImSpan<signed_char> *)(local_8 + 8),local_98);
        pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                            ((ImSpan<ImGuiTableColumn> *)in_stack_fffffffffffffee0,(int)*pcVar9);
        if ((pIVar10->Flags & 4U) != 0) {
          pIVar10->WidthRequest = pIVar10->WidthRequest + 1.0;
          pIVar10->WidthGiven = pIVar10->WidthGiven + 1.0;
          local_80 = local_80 - 1.0;
        }
      }
    }
  }
  *(undefined1 *)(local_8 + 0x8d) = 0xff;
  *(undefined1 *)((long)local_8 + 0x235) = 0xff;
  IVar18 = local_8[0x3b];
  idx = local_8[0x3c];
  IVar17 = local_8[0x3d];
  ImMax<float>((float)local_8[0x3e],(float)local_8[0x3c] + (float)local_8[0x33]);
  ImRect::ImRect((ImRect *)CONCAT44(idx,in_stack_fffffffffffffed0),in_stack_fffffffffffffecc,
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffec0);
  bVar5 = ItemHoverable((ImRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (ImGuiID)in_stack_fffffffffffffec4);
  local_b8 = 0;
  bVar7 = '\0' < *(char *)((long)local_8 + 0x243);
  if (*(char *)((long)local_8 + 0x243) < '\x01') {
    fVar13 = local_70.Min.x;
  }
  else {
    fVar13 = (float)local_8[0x3b];
  }
  local_c0 = (fVar13 + (float)local_8[0x2e]) - (float)local_8[0x31];
  local_d0 = *(ulong *)(local_8 + 0x47);
  uVar2 = *(undefined8 *)(local_8 + 0x49);
  local_8[0x14] = 0;
  local_8[0x15] = 0;
  local_8[0x16] = 0;
  local_8[0x17] = 0;
  for (local_d4 = 0; local_d4 < (int)local_8[0x1b]; local_d4 = local_d4 + 1) {
    pbVar11 = (byte *)ImSpan<signed_char>::operator[]((ImSpan<signed_char> *)(local_8 + 8),local_d4)
    ;
    bVar15 = *pbVar11;
    i = (int)(char)bVar15;
    pIVar10 = ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(local_8 + 4),i);
    uVar16 = SUB43(in_stack_fffffffffffffecc,0);
    in_stack_fffffffffffffecc = (float)CONCAT13(1,uVar16);
    if (*(char *)((long)local_8 + 0x241) < '\x01') {
      in_stack_fffffffffffffecc = (float)CONCAT13(i < *(char *)((long)local_8 + 0x243),uVar16);
    }
    pIVar10->NavLayerCurrent = (char)((uint)in_stack_fffffffffffffecc >> 0x18) != '\0';
    if ((bVar7) && (*(char *)((long)local_8 + 0x243) == local_b8)) {
      local_c0 = (local_70.Min.x - (float)local_8[0x3b]) + local_c0;
      bVar7 = false;
    }
    pIVar10->Flags = pIVar10->Flags & 0xff0fffff;
    if ((*(ulong *)(local_8 + 0x10) & 1L << ((byte)local_d4 & 0x3f)) == 0) {
      (pIVar10->ClipRect).Max.x = local_c0;
      (pIVar10->ClipRect).Min.x = local_c0;
      pIVar10->WorkMinX = local_c0;
      pIVar10->MaxX = local_c0;
      pIVar10->MinX = local_c0;
      pIVar10->WidthGiven = 0.0;
      (pIVar10->ClipRect).Min.y = local_70.Min.y;
      (pIVar10->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull((ImRect *)in_stack_fffffffffffffee0,(ImRect *)CONCAT44(IVar18,IVar17));
      pIVar10->IsRequestOutput = false;
      pIVar10->IsVisibleY = false;
      pIVar10->IsVisibleX = false;
      pIVar10->IsSkipItems = true;
      pIVar10->ItemWidth = 1.0;
    }
    else {
      if (((bVar5) && ((pIVar10->ClipRect).Min.x <= (local_10->IO).MousePos.x)) &&
         ((local_10->IO).MousePos.x < (pIVar10->ClipRect).Max.x)) {
        *(byte *)(local_8 + 0x8d) = bVar15;
      }
      pIVar10->MinX = local_c0;
      fVar14 = TableGetMaxColumnWidth
                         ((ImGuiTable *)CONCAT44(idx,fVar13),(int)in_stack_fffffffffffffecc);
      fVar14 = ImMin<float>(pIVar10->WidthGiven,fVar14);
      pIVar10->WidthGiven = fVar14;
      fVar14 = pIVar10->WidthGiven;
      rhs = ImMin<float>(pIVar10->WidthRequest,(float)local_8[0x2d]);
      fVar14 = ImMax<float>(fVar14,rhs);
      pIVar10->WidthGiven = fVar14;
      pIVar10->MaxX =
           (float)local_8[0x2f] + (float)local_8[0x2f] +
           local_c0 + pIVar10->WidthGiven + (float)local_8[0x31] + (float)local_8[0x32];
      pIVar10->WorkMinX = pIVar10->MinX + (float)local_8[0x2f] + (float)local_8[0x31];
      pIVar10->WorkMaxX = (pIVar10->MaxX - (float)local_8[0x2f]) - (float)local_8[0x32];
      fVar14 = ImFloor(pIVar10->WidthGiven * 0.65);
      pIVar10->ItemWidth = fVar14;
      (pIVar10->ClipRect).Min.x = pIVar10->MinX;
      (pIVar10->ClipRect).Min.y = local_70.Min.y;
      (pIVar10->ClipRect).Max.x = pIVar10->MaxX;
      (pIVar10->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull((ImRect *)in_stack_fffffffffffffee0,(ImRect *)CONCAT44(IVar18,IVar17));
      fVar14 = (pIVar10->ClipRect).Max.x;
      pIVar10->IsVisibleX =
           (pIVar10->ClipRect).Min.x <= fVar14 && fVar14 != (pIVar10->ClipRect).Min.x;
      pIVar10->IsVisibleY = true;
      bVar6 = pIVar10->IsVisibleX & 1;
      if (bVar6 != 0) {
        *(ulong *)(local_8 + 0x14) = 1L << (bVar15 & 0x3f) | *(ulong *)(local_8 + 0x14);
      }
      bVar12 = true;
      if ((bVar6 == 0) && (bVar12 = true, pIVar10->AutoFitQueue == '\0')) {
        bVar12 = pIVar10->CannotSkipItemsQueue != '\0';
      }
      pIVar10->IsRequestOutput = bVar12;
      if ((pIVar10->IsRequestOutput & 1U) != 0) {
        *(ulong *)(local_8 + 0x16) = 1L << (bVar15 & 0x3f) | *(ulong *)(local_8 + 0x16);
      }
      bVar15 = 1;
      if ((pIVar10->IsEnabled & 1U) != 0) {
        bVar15 = *(byte *)((long)local_8 + 0x256);
      }
      pIVar10->IsSkipItems = (bool)(bVar15 & 1);
      pIVar10->Flags = pIVar10->Flags | 0x100000;
      if (bVar6 != 0) {
        pIVar10->Flags = pIVar10->Flags | 0x200000;
      }
      if (pIVar10->SortOrder != -1) {
        pIVar10->Flags = pIVar10->Flags | 0x400000;
      }
      if ((char)local_8[0x8d] == i) {
        pIVar10->Flags = pIVar10->Flags | 0x800000;
      }
      pIVar10->ContentMaxXUnfrozen = pIVar10->WorkMinX;
      pIVar10->ContentMaxXFrozen = pIVar10->WorkMinX;
      pIVar10->ContentMaxXHeadersIdeal = pIVar10->WorkMinX;
      pIVar10->ContentMaxXHeadersUsed = pIVar10->WorkMinX;
      if ((*(byte *)((long)local_8 + 0x256) & 1) == 0) {
        pIVar10->AutoFitQueue = (ImU8)((int)(uint)pIVar10->AutoFitQueue >> 1);
        pIVar10->CannotSkipItemsQueue = (ImU8)((int)(uint)pIVar10->CannotSkipItemsQueue >> 1);
      }
      if (local_b8 < *(char *)((long)local_8 + 0x243)) {
        local_c8 = (float)uVar2;
        fVar14 = ImClamp<float>(pIVar10->MaxX + 1.0,(float)local_d0,local_c8);
        local_d0 = (ulong)(uint)fVar14;
      }
      local_c0 = (float)local_8[0x2f] + (float)local_8[0x2f] +
                 pIVar10->WidthGiven + (float)local_8[0x31] + (float)local_8[0x32] + local_c0;
      local_b8 = local_b8 + 1;
    }
  }
  fVar13 = (float)local_8[0x43];
  pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                      ((ImSpan<ImGuiTableColumn> *)(local_8 + 4),
                       (int)*(char *)((long)local_8 + 0x23e));
  fVar13 = ImMax<float>(fVar13,(pIVar10->ClipRect).Max.x);
  if (((bVar5) && ((char)local_8[0x8d] == -1)) && (fVar13 <= (local_10->IO).MousePos.x)) {
    *(char *)(local_8 + 0x8d) = (char)local_8[0x1b];
  }
  if (((local_22 & 1) == 0) && ((local_8[1] & 1) != 0)) {
    local_8[1] = local_8[1] & 0xfffffffe;
  }
  if (*(char *)((long)local_8 + 0x23d) != -1) {
    local_8[1] = local_8[1] & 0xfffeffff;
  }
  if ((local_8[1] & 0x10000) != 0) {
    local_8[0x45] = (ImU32)fVar13;
    local_8[0x3d] = (ImU32)fVar13;
    fVar14 = ImMin<float>((float)local_8[0x49],fVar13);
    local_8[0x49] = (ImU32)fVar14;
  }
  lVar3 = *(long *)(local_8 + 0x74);
  *(undefined8 *)(lVar3 + 0x248) = *(undefined8 *)(local_8 + 0x43);
  *(undefined8 *)(lVar3 + 0x250) = *(undefined8 *)(local_8 + 0x45);
  local_8[0x2a] = local_8[0x47];
  local_8[0x2b] = local_8[0x49];
  TableSetupDrawChannels
            ((ImGuiTable *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,CONCAT24(in_stack_fffffffffffffef4,id))));
  if ((local_8[1] & 1) != 0) {
    TableUpdateBorders((ImGuiTable *)CONCAT44(fVar13,in_stack_ffffffffffffff10));
  }
  local_8[0x34] = 0;
  *(undefined1 *)(local_8 + 0x92) = 1;
  *(undefined1 *)(local_8 + 0x93) = 0;
  if (((*(byte *)((long)local_8 + 0x24d) & 1) != 0) &&
     ((short)local_8[0x1e] == *(short *)((long)local_8 + 0x7a))) {
    IVar8 = ImHashStr("##ContextMenu",0,*local_8);
    bVar7 = BeginPopupEx((ImGuiID)id,(ImGuiWindowFlags)in_stack_fffffffffffffeec);
    if (bVar7) {
      TableDrawContextMenu((ImGuiTable *)CONCAT44(fVar13,IVar8));
      EndPopup();
    }
    else {
      *(undefined1 *)((long)local_8 + 0x24d) = 0;
    }
  }
  if (((*(byte *)((long)local_8 + 0x24b) & 1) != 0) && ((local_8[1] & 8) != 0)) {
    TableSortSpecsBuild((ImGuiTable *)
                        CONCAT17(in_stack_fffffffffffffef7,
                                 CONCAT16(in_stack_fffffffffffffef6,
                                          CONCAT24(in_stack_fffffffffffffef4,id))));
  }
  if ((local_8[1] & 0x100000) == 0) {
    cr_min.y._0_2_ = in_stack_fffffffffffffef4;
    cr_min.x = id;
    cr_min.y._2_1_ = in_stack_fffffffffffffef6;
    cr_min.y._3_1_ = in_stack_fffffffffffffef7;
    cr_max.y = in_stack_fffffffffffffeec;
    cr_max.x = in_stack_fffffffffffffee8;
    ImDrawList::PushClipRect(in_stack_fffffffffffffee0,cr_min,cr_max,SUB41(IVar18 >> 0x18,0));
  }
  else {
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)in_stack_fffffffffffffee0,(ImDrawList *)CONCAT44(IVar18,IVar17)
               ,idx);
  }
  return;
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int last_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings/sortspecs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsEnabledNextFrame = true;
        if (column->IsEnabled != column->IsEnabledNextFrame)
        {
            column->IsEnabled = column->IsEnabledNextFrame;
            table->IsSettingsDirty = true;
            if (!column->IsEnabled && column->SortOrder != -1)
                table->IsSortSpecsDirty = true;
        }
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)last_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (last_visible_column_idx != -1)
            table->Columns[last_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        last_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)last_visible_column_idx;
    IM_ASSERT(table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto; 

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}